

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

bool __thiscall
Gudhi::Simplex_tree<MyOptions>::prune_above_filtration
          (Simplex_tree<MyOptions> *this,Filtration_value *filtration)

{
  double dVar1;
  Filtration_value *pFVar2;
  Siblings *sib;
  bool modified;
  Filtration_value *filtration_local;
  Simplex_tree<MyOptions> *this_local;
  
  dVar1 = *filtration;
  pFVar2 = Filtration_simplex_base_real::get_infinity();
  if ((dVar1 != *pFVar2) || (NAN(dVar1) || NAN(*pFVar2))) {
    sib = root(this);
    this_local._7_1_ = rec_prune_above_filtration(this,sib,filtration);
    if (this_local._7_1_) {
      clear_filtration(this);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool prune_above_filtration(const Filtration_value& filtration) {
    if (filtration == Filtration_simplex_base_real::get_infinity())
      return false;  // ---->>
    bool modified = rec_prune_above_filtration(root(), filtration);
    if(modified)
      clear_filtration(); // Drop the cache.
    return modified;
  }